

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

_Bool sockaddr_is_loopback(sockaddr *sa)

{
  sa_family_t sVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  in6_addr *__a;
  sockaddr_union *u;
  sockaddr *sa_local;
  
  sVar1 = sa->sa_family;
  if (sVar1 == 1) {
    sa_local._7_1_ = true;
  }
  else if (sVar1 == 2) {
    uVar2 = *(uint *)(sa->sa_data + 2);
    uVar4 = htonl(0xff000000);
    uVar5 = htonl(0x7f000000);
    sa_local._7_1_ = (uVar2 & uVar4) == uVar5;
  }
  else if (sVar1 == 10) {
    sa_local._7_1_ = false;
    if (((*(int *)(sa->sa_data + 6) == 0) &&
        (sa_local._7_1_ = false, *(int *)(sa->sa_data + 10) == 0)) &&
       (iVar3._0_2_ = sa[1].sa_family, iVar3._2_1_ = sa[1].sa_data[0],
       iVar3._3_1_ = sa[1].sa_data[1], sa_local._7_1_ = false, iVar3 == 0)) {
      uVar4 = *(uint32_t *)(sa[1].sa_data + 2);
      uVar5 = htonl(1);
      sa_local._7_1_ = uVar4 == uVar5;
    }
  }
  else {
    sa_local._7_1_ = false;
  }
  return sa_local._7_1_;
}

Assistant:

static bool sockaddr_is_loopback(struct sockaddr *sa)
{
    union sockaddr_union *u = (union sockaddr_union *)sa;
    switch (u->sa.sa_family) {
      case AF_INET:
        return ipv4_is_loopback(u->sin.sin_addr);
#ifndef NO_IPV6
      case AF_INET6:
        return IN6_IS_ADDR_LOOPBACK(&u->sin6.sin6_addr);
#endif
      case AF_UNIX:
        return true;
      default:
        return false;
    }
}